

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

iterator __thiscall
QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
::erase(QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
        *this,iterator it)

{
  iterator ppQVar1;
  iterator iVar2;
  
  QVLABase<QDialogButtonBox::StandardButton>::erase
            (&(this->c).values.super_QVLABase<QDialogButtonBox::StandardButton>,
             (const_iterator)
             (it.i * 4 +
             (long)(this->c).values.super_QVLABase<QDialogButtonBox::StandardButton>.
                   super_QVLABaseBase.ptr));
  ppQVar1 = QVLABase<QPushButton_*>::erase
                      ((QVLABase<QPushButton_*> *)this,
                       (const_iterator)
                       (it.i * 8 +
                       (long)(this->c).keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr));
  iVar2.i = (long)ppQVar1 -
            (long)(this->c).keys.super_QVLABase<QPushButton_*>.super_QVLABaseBase.ptr >> 3;
  iVar2.c = &this->c;
  return iVar2;
}

Assistant:

iterator erase(iterator it)
    {
        c.values.erase(toValuesIterator(it));
        return fromKeysIterator(c.keys.erase(toKeysIterator(it)));
    }